

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.h
# Opt level: O0

bool __thiscall
Assimp::IFC::TempOpening::DistanceSorter::operator()
          (DistanceSorter *this,TempOpening *a,TempOpening *b)

{
  element_type *peVar1;
  double dVar2;
  double dVar3;
  IfcVector3 local_80;
  aiVector3t<double> local_68;
  IfcVector3 local_50;
  aiVector3t<double> local_38;
  TempOpening *local_20;
  TempOpening *b_local;
  TempOpening *a_local;
  DistanceSorter *this_local;
  
  local_20 = b;
  b_local = a;
  a_local = (TempOpening *)this;
  peVar1 = std::__shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&a->profileMesh);
  TempMesh::Center(&local_50,peVar1);
  ::operator-(&local_38,&local_50,&this->base);
  dVar2 = aiVector3t<double>::SquareLength(&local_38);
  peVar1 = std::__shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_20->profileMesh);
  TempMesh::Center(&local_80,peVar1);
  ::operator-(&local_68,&local_80,&this->base);
  dVar3 = aiVector3t<double>::SquareLength(&local_68);
  return dVar2 < dVar3;
}

Assistant:

bool operator () (const TempOpening& a, const TempOpening& b) const {
            return (a.profileMesh->Center()-base).SquareLength() < (b.profileMesh->Center()-base).SquareLength();
        }